

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

Type * slang::ast::UnpackedStructType::fromSyntax(ASTContext *context,StructUnionTypeSyntax *syntax)

{
  Token *this;
  undefined1 *puVar1;
  byte *pbVar2;
  TokenKind TVar3;
  Compilation *args;
  size_t sVar4;
  StructUnionMemberSyntax *pSVar5;
  SyntaxNode *syntax_00;
  DeclaratorSyntax *decl;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar6;
  StructUnionTypeSyntax *pSVar7;
  int iVar8;
  UnpackedStructType *pUVar9;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar10;
  Type *pTVar11;
  uint64_t uVar12;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_03;
  pointer ppSVar13;
  UnpackedStructType *pUVar14;
  ulong uVar15;
  uint64_t uVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  SourceRange sourceRange;
  FieldSymbol *field;
  uint64_t bitOffset;
  SmallVector<const_slang::ast::FieldSymbol_*,_5UL> fields;
  RandMode local_e4;
  FieldSymbol *local_d8;
  unsigned_long local_d0;
  Compilation *local_c8;
  uint local_bc;
  StructUnionTypeSyntax *local_b8;
  Scope *local_b0;
  ASTContext *local_a8;
  pointer local_a0;
  pointer local_98;
  UnpackedStructType *local_90;
  SourceLocation local_88;
  string_view local_80;
  SmallVectorBase<const_slang::ast::FieldSymbol_*> local_70 [2];
  
  args = ((context->scope).ptr)->compilation;
  local_70[0].data_ = (pointer)parsing::Token::location(&syntax->keyword);
  local_c8 = args;
  local_a8 = context;
  pUVar9 = BumpAllocator::
           emplace<slang::ast::UnpackedStructType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::ASTContext_const&>
                     (&args->super_BumpAllocator,args,(SourceLocation *)local_70,context);
  uVar16 = 0;
  local_d0 = 0;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  sVar4 = (syntax->members).
          super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  bVar19 = sVar4 == 0;
  src = extraout_RDX;
  local_b8 = syntax;
  if (!bVar19) {
    ppSVar13 = (syntax->members).
               super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
    local_a0 = ppSVar13 + sVar4;
    local_b0 = &pUVar9->super_Scope;
    uVar16 = 0;
    do {
      pSVar5 = *ppSVar13;
      syntax_00 = (pSVar5->super_SyntaxNode).previewNode;
      if (syntax_00 != (SyntaxNode *)0x0) {
        Scope::addMembers(local_b0,syntax_00);
        src = extraout_RDX_00;
      }
      TVar3 = (pSVar5->randomQualifier).kind;
      if (TVar3 == RandCKeyword) {
        local_e4 = RandC;
LAB_00425d28:
        bVar6 = false;
      }
      else {
        if (TVar3 == RandKeyword) {
          local_e4 = Rand;
          goto LAB_00425d28;
        }
        local_e4 = None;
        bVar6 = true;
      }
      uVar15 = (pSVar5->declarators).elements._M_extent._M_extent_value + 1;
      bVar18 = uVar15 < 2;
      local_98 = ppSVar13;
      if (!bVar18) {
        uVar15 = uVar15 >> 1;
        lVar17 = 0;
        do {
          ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )((long)&(((pSVar5->declarators).elements._M_ptr)->
                                         super_ConstTokenOrSyntax).
                                         super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                 + lVar17));
          decl = (DeclaratorSyntax *)*ppSVar10;
          this = &decl->name;
          local_80 = parsing::Token::valueText(this);
          local_88 = parsing::Token::location(this);
          local_bc = (uint)local_70[0].len;
          local_d8 = BumpAllocator::
                     emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_long&,unsigned_int>
                               (&local_c8->super_BumpAllocator,&local_80,&local_88,&local_d0,
                                &local_bc);
          (local_d8->super_VariableSymbol).super_ValueSymbol.declaredType.typeOrLink =
               (anon_union_8_2_f12d5f64_for_typeOrLink)(pSVar5->type).ptr;
          puVar1 = &(local_d8->super_VariableSymbol).super_ValueSymbol.declaredType.field_0x3f;
          *puVar1 = *puVar1 & 0x7f;
          ValueSymbol::setFromDeclarator((ValueSymbol *)local_d8,decl);
          syntax_01._M_ptr =
               (pSVar5->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_01._M_extent._M_extent_value =
               (pSVar5->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes((Symbol *)local_d8,(local_a8->scope).ptr,syntax_01);
          local_d8->randMode = local_e4;
          if (!bVar6) {
            pbVar2 = (byte *)((long)&(local_d8->super_VariableSymbol).super_ValueSymbol.declaredType
                                     .flags.m_bits + 1);
            *pbVar2 = *pbVar2 | 2;
          }
          Scope::insertMember(local_b0,(Symbol *)local_d8,(pUVar9->super_Scope).lastMember,false,
                              true);
          SmallVectorBase<slang::ast::FieldSymbol_const*>::
          emplace_back<slang::ast::FieldSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::FieldSymbol_const*> *)local_70,&local_d8);
          pTVar11 = DeclaredType::getType
                              (&(local_d8->super_VariableSymbol).super_ValueSymbol.declaredType);
          uVar12 = Type::getSelectableWidth(pTVar11);
          local_d0 = local_d0 + uVar12;
          pTVar11 = DeclaredType::getType
                              (&(local_d8->super_VariableSymbol).super_ValueSymbol.declaredType);
          uVar12 = Type::getBitstreamWidth(pTVar11);
          uVar16 = uVar16 + uVar12;
          if (0x3fffffff8 < uVar16 || 0x3fffffff8 < local_d0) {
            sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
            ASTContext::addDiag(local_a8,(DiagCode)0x180009,sourceRange);
            local_90 = (UnpackedStructType *)local_c8->errorType;
            src = extraout_RDX_02;
            break;
          }
          lVar17 = lVar17 + 0x30;
          uVar15 = uVar15 - 1;
          bVar18 = uVar15 == 0;
          src = extraout_RDX_01;
        } while (!bVar18);
      }
      if (!bVar18) break;
      ppSVar13 = local_98 + 1;
      bVar19 = ppSVar13 == local_a0;
    } while (!bVar19);
  }
  pUVar14 = local_90;
  if (bVar19) {
    pUVar9->selectableWidth = local_d0;
    pUVar9->bitstreamWidth = uVar16;
    iVar8 = SmallVectorBase<const_slang::ast::FieldSymbol_*>::copy
                      (local_70,(EVP_PKEY_CTX *)local_c8,src);
    pSVar7 = local_b8;
    (pUVar9->fields)._M_ptr = (pointer)CONCAT44(extraout_var,iVar8);
    (pUVar9->fields)._M_extent._M_extent_value = extraout_RDX_03;
    if (extraout_RDX_03 != 0) {
      lVar17 = 0;
      do {
        DeclaredType::getInitializer
                  ((DeclaredType *)(*(long *)((long)CONCAT44(extraout_var,iVar8) + lVar17) + 0x40));
        lVar17 = lVar17 + 8;
      } while (extraout_RDX_03 * 8 - lVar17 != 0);
    }
    (pUVar9->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)pSVar7;
    pUVar14 = pUVar9;
  }
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return &pUVar14->super_Type;
}

Assistant:

const Type& UnpackedStructType::fromSyntax(const ASTContext& context,
                                           const StructUnionTypeSyntax& syntax) {
    SLANG_ASSERT(!syntax.packed);

    auto& comp = context.getCompilation();
    auto result = comp.emplace<UnpackedStructType>(comp, syntax.keyword.location(), context);

    uint64_t bitOffset = 0;
    uint64_t bitstreamWidth = 0;
    SmallVector<const FieldSymbol*> fields;
    for (auto member : syntax.members) {
        if (member->previewNode)
            result->addMembers(*member->previewNode);

        RandMode randMode = RandMode::None;
        switch (member->randomQualifier.kind) {
            case TokenKind::RandKeyword:
                randMode = RandMode::Rand;
                break;
            case TokenKind::RandCKeyword:
                randMode = RandMode::RandC;
                break;
            default:
                break;
        }

        for (auto decl : member->declarators) {
            auto field = comp.emplace<FieldSymbol>(decl->name.valueText(), decl->name.location(),
                                                   bitOffset, (uint32_t)fields.size());
            field->setDeclaredType(*member->type);
            field->setFromDeclarator(*decl);
            field->setAttributes(*context.scope, member->attributes);
            field->randMode = randMode;

            if (randMode != RandMode::None)
                field->getDeclaredType()->addFlags(DeclaredTypeFlags::Rand);

            result->addMember(*field);
            fields.push_back(field);

            bitOffset += field->getType().getSelectableWidth();
            bitstreamWidth += field->getType().getBitstreamWidth();
            if (bitOffset > MaxBitWidth || bitstreamWidth > MaxBitWidth) {
                context.addDiag(diag::ObjectTooLarge, syntax.sourceRange());
                return comp.getErrorType();
            }
        }
    }

    result->selectableWidth = bitOffset;
    result->bitstreamWidth = bitstreamWidth;
    result->fields = fields.copy(comp);
    for (auto field : result->fields) {
        // Force resolution of the initializer right away, otherwise nothing
        // is required to force it later.
        field->getInitializer();
    }

    result->setSyntax(syntax);
    return *result;
}